

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

tb_page_addr_t
get_page_addr_code_hostp_riscv32
          (CPUArchState_conflict25 *env,target_ulong_conflict addr,void **hostp)

{
  _Bool _Var1;
  int mmu_idx;
  ram_addr_t rVar2;
  ulong uVar3;
  uint uVar4;
  size_t mmu_idx_00;
  void *ptr;
  long lVar5;
  uint uVar6;
  uint page;
  CPURISCVState_conflict *__mptr;
  
  mmu_idx = riscv_cpu_mmu_index_riscv32(env,true);
  mmu_idx_00 = (size_t)mmu_idx;
  uVar4 = env->gpr[mmu_idx_00 * 4 + -0x14] >> 6 & addr >> 0xc;
  uVar3 = (ulong)(uVar4 << 6);
  lVar5 = *(long *)(env->gpr + mmu_idx_00 * 4 + -0x12) + uVar3;
  uVar6 = *(uint *)(*(long *)(env->gpr + mmu_idx_00 * 4 + -0x12) + 8 + uVar3);
  page = addr & 0xfffff000;
  rVar2 = 0xffffffffffffffff;
  if ((uVar6 & 0xfffff800) != page) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,(ulong)uVar4,8,page);
    if (_Var1) {
      uVar6 = *(uint *)(lVar5 + 8);
    }
    else {
      tlb_fill((CPUState_conflict *)(env[-0x26].pmp_state.pmp + 5),addr,0,MMU_INST_FETCH,mmu_idx,0);
      uVar3 = (ulong)((addr >> 0xc & env->gpr[mmu_idx_00 * 4 + -0x14] >> 6) << 6);
      uVar6 = *(uint *)(*(long *)(env->gpr + mmu_idx_00 * 4 + -0x12) + 8 + uVar3);
      if ((uVar6 >> 0xb & 1) != 0) {
        return 0xffffffffffffffff;
      }
      lVar5 = *(long *)(env->gpr + mmu_idx_00 * 4 + -0x12) + uVar3;
    }
    if ((uVar6 & 0xfffff800) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_riscv32(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((uVar6 >> 9 & 1) == 0) {
    ptr = (void *)((ulong)addr + *(long *)(lVar5 + 0x10));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    rVar2 = qemu_ram_addr_from_host_riscv32(env->uc,ptr);
    if (rVar2 == 0xffffffffffffffff) {
      abort();
    }
  }
  else if (hostp != (void **)0x0) {
    *hostp = (void *)0x0;
  }
  return rVar2;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}